

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDiscreteDynamicsWorld.cpp
# Opt level: O2

void __thiscall InplaceSolverIslandCallback::processConstraints(InplaceSolverIslandCallback *this)

{
  btPersistentManifold *local_28;
  
  local_28 = (btPersistentManifold *)this;
  (*this->m_solver->_vptr_btConstraintSolver[3])();
  local_28 = (btPersistentManifold *)0x0;
  btAlignedObjectArray<btCollisionObject_*>::resize
            (&this->m_bodies,0,(btCollisionObject **)&local_28);
  local_28 = (btPersistentManifold *)0x0;
  btAlignedObjectArray<btPersistentManifold_*>::resize(&this->m_manifolds,0,&local_28);
  local_28 = (btPersistentManifold *)0x0;
  btAlignedObjectArray<btTypedConstraint_*>::resize
            (&this->m_constraints,0,(btTypedConstraint **)&local_28);
  return;
}

Assistant:

void	processConstraints()
	{

		btCollisionObject** bodies = m_bodies.size()? &m_bodies[0]:0;
		btPersistentManifold** manifold = m_manifolds.size()?&m_manifolds[0]:0;
		btTypedConstraint** constraints = m_constraints.size()?&m_constraints[0]:0;

		m_solver->solveGroup( bodies,m_bodies.size(),manifold, m_manifolds.size(),constraints, m_constraints.size() ,*m_solverInfo,m_debugDrawer,m_dispatcher);
		m_bodies.resize(0);
		m_manifolds.resize(0);
		m_constraints.resize(0);

	}